

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_var_tests.cpp
# Opt level: O2

int SetUpEnvironmentImpl(void)

{
  int iVar1;
  int iVar2;
  
  iVar1 = putenv("GTEST_SHUFFLE=1");
  iVar2 = -1;
  if (iVar1 != -1) {
    iVar1 = putenv("GTEST_RANDOM_SEED=200");
    if (iVar1 != -1) {
      iVar1 = putenv("GTEST_ALSO_RUN_DISABLED_TESTS=1");
      if (iVar1 != -1) {
        iVar1 = putenv("GTEST_BREAK_ON_FAILURE=1");
        if (iVar1 != -1) {
          iVar1 = putenv("GTEST_THROW_ON_FAILURE=1");
          if (iVar1 != -1) {
            iVar1 = putenv("GTEST_CATCH_EXCEPTIONS=0");
            if (iVar1 != -1) {
              iVar1 = putenv("GTEST_PRINT_TIME=0");
              if (iVar1 != -1) {
                iVar1 = putenv("GTEST_REPEAT=2");
                if (iVar1 != -1) {
                  iVar1 = putenv("GTEST_FILTER=Flag*");
                  if (iVar1 != -1) {
                    iVar1 = putenv("GTEST_OUTPUT=test");
                    if (iVar1 != -1) {
                      iVar1 = putenv("XML_OUTPUT_FILE=hoge");
                      if (iVar1 != -1) {
                        iVar1 = putenv("IUTEST_DEFAULT_PACKAGE_NAME=env_var");
                        if (iVar1 != -1) {
                          iVar1 = putenv("IUTEST_FILE_LOCATION=vs");
                          if (iVar1 != -1) {
                            iVar2 = putenv("IUTEST_WARNING_INTO_ERROR=1");
                            iVar2 = -(uint)(iVar2 == -1);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
    (void)argv;

#ifdef UNICODE
    wchar_t a[] = L"";
    wchar_t* targv[] = { a };
#else
    char a[] = "";
    char* targv[] =  { a };
#endif
    int targc = 1;
    IUTEST_INIT(&targc, targv);
#if !defined(IUTEST_USE_GTEST)
    if( g_result.setup_environment == 0 && ::iutest::IUTEST_FLAG(warning_into_error) )
    {
        if( IUTEST_RUN_ALL_TESTS() == 0 ) return 1;
    }
    else
#endif
    {
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    return 0;
}